

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void TestFreeList(void)

{
  _List_node_base *p_Var1;
  undefined8 ****ppppuVar2;
  undefined8 ****ppppuVar3;
  bool bVar4;
  undefined8 ***pppuVar5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  uint uVar9;
  ulong unaff_RBP;
  long lVar10;
  _List_node_base *unaff_R14;
  list<People_*,_std::allocator<People_*>_> check_list;
  undefined8 ***local_48;
  undefined8 ***local_40;
  long local_38;
  
  puts("===================== TestFreeList BEGIN =====================");
  local_48 = &local_48;
  local_38 = 0;
  lVar10 = 10;
  bVar4 = false;
  p_Var8 = (_List_node_base *)0x0;
  local_40 = local_48;
  do {
    p_Var6 = unaff_R14;
    if (bVar4) {
      unaff_R14 = p_Var6;
      if (unaff_RBP < 8) goto LAB_001048d4;
      unaff_RBP = unaff_RBP - 8;
LAB_00104901:
      unaff_R14 = (_List_node_base *)&p_Var6->_M_prev;
    }
    else {
      bVar4 = true;
      unaff_R14 = (_List_node_base *)0x0;
      unaff_RBP = 0;
LAB_001048d4:
      p_Var6 = (_List_node_base *)mmap((void *)0x0,0x8000000,3,0x22,-1,0);
      if (p_Var6 != (_List_node_base *)0xffffffffffffffff) {
        unaff_RBP = 0x7fffff8;
        goto LAB_00104901;
      }
      p_Var6 = (_List_node_base *)0x0;
    }
    p_Var7 = (_List_node_base *)operator_new(0x18);
    p_Var7[1]._M_next = p_Var6;
    std::__detail::_List_node_base::_M_hook(p_Var7);
    local_38 = local_38 + 1;
    p_Var6->_M_next = p_Var8;
    lVar10 = lVar10 + -1;
    p_Var8 = p_Var6;
    if (lVar10 == 0) {
      lVar10 = 10;
      uVar9 = 0xb;
      p_Var8 = (_List_node_base *)0x0;
      do {
        pppuVar5 = local_48;
        uVar9 = uVar9 - 1;
        if (uVar9 != (uint)lVar10) {
          __assert_fail("freelist.FreeObjects() == i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                        ,0x45,"void TestFreeList()");
        }
        if (lVar10 == 0) {
          lVar10 = 0;
          p_Var7 = (_List_node_base *)0x0;
        }
        else {
          lVar10 = lVar10 + -1;
          p_Var7 = p_Var6;
          p_Var6 = p_Var6->_M_next;
        }
        p_Var1 = (_List_node_base *)local_48[2];
        if (p_Var7 != p_Var1) {
          __assert_fail("(People*)freelist.PopFront() == check_list.front()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                        ,0x46,"void TestFreeList()");
        }
        if (!bVar4) {
          __assert_fail("inited",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/fixed_allocator.hpp"
                        ,0x22,"void tcmalloc::FixedAllocator<People>::Free(T *) [T = People]");
        }
        p_Var1->_M_next = p_Var8;
        local_38 = local_38 + -1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(pppuVar5,0x18);
        p_Var8 = p_Var1;
      } while (1 < uVar9);
      if (lVar10 != 0) {
        __assert_fail("freelist.Empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                      ,0x4a,"void TestFreeList()");
      }
      puts("===================== TestFreeList Finish =====================");
      ppppuVar3 = (undefined8 ****)local_48;
      while (ppppuVar3 != &local_48) {
        ppppuVar2 = (undefined8 ****)*ppppuVar3;
        operator_delete(ppppuVar3,0x18);
        ppppuVar3 = ppppuVar2;
      }
      return;
    }
  } while( true );
}

Assistant:

void TestFreeList() {
    printf("===================== TestFreeList BEGIN =====================\n");
    struct People {
        People(int age) : age_(age) {}
        int     age_;
        int     padding;
    };
    tcmalloc::FixedAllocator<People> allocator;

    std::list<People*> check_list;
    tcmalloc::FreeList freelist;
    assert(freelist.Empty());
    for (int i = 0; i < 10; ++i) {
        People* ptr = allocator.Alloc();
        check_list.push_front(ptr);
        freelist.PushFront(ptr);
        assert(freelist.FreeObjects() == (i+1));
    }
    for (int i = 10; i > 0; --i) {
        assert(freelist.FreeObjects() == i);
        assert((People*)freelist.PopFront() == check_list.front());
        allocator.Free(check_list.front());
        check_list.pop_front();
    }
    assert(freelist.Empty());
    printf("===================== TestFreeList Finish =====================\n");
}